

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O2

string * __thiscall
Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship_abi_cxx11_
          (string *__return_storage_ptr__,D3MFOpcPackage *this,IOStream *stream)

{
  pointer psVar1;
  bool bVar2;
  CIrrXML_IOStreamReader *this_00;
  shared_ptr<Assimp::D3MF::OpcPackageRelationship> *xmlReader;
  DeadlyImportError *this_01;
  long lVar3;
  __normal_iterator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_*,_std::vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>_>
  __it;
  _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
  *this_02;
  _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
  *p_Var4;
  long lVar5;
  OpcPackageRelationshipReader reader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,stream);
  xmlReader = (shared_ptr<Assimp::D3MF::OpcPackageRelationship> *)
              irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
  __it._M_current = xmlReader;
  OpcPackageRelationshipReader::OpcPackageRelationshipReader(&reader,(XmlReader *)xmlReader);
  psVar1 = reader.m_relationShips.
           super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)reader.m_relationShips.
                super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)reader.m_relationShips.
                super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  this_02 = (_Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
             *)reader.m_relationShips.
               super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  for (lVar3 = lVar5 >> 6; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
            ::operator()(this_02,__it);
    p_Var4 = this_02;
    if (bVar2) goto LAB_0057de9f;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
            ::operator()(this_02 + 0x10,__it);
    p_Var4 = this_02 + 0x10;
    if (bVar2) goto LAB_0057de9f;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
            ::operator()(this_02 + 0x20,__it);
    p_Var4 = this_02 + 0x20;
    if (bVar2) goto LAB_0057de9f;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
            ::operator()(this_02 + 0x30,__it);
    p_Var4 = this_02 + 0x30;
    if (bVar2) goto LAB_0057de9f;
    this_02 = this_02 + 0x40;
    lVar5 = lVar5 + -0x40;
  }
  lVar5 = lVar5 >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      p_Var4 = (_Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
                *)psVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
                  ::operator()(this_02,__it), p_Var4 = this_02, bVar2)) goto LAB_0057de9f;
      this_02 = this_02 + 0x10;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
            ::operator()(this_02,__it);
    p_Var4 = this_02;
    if (bVar2) goto LAB_0057de9f;
    this_02 = this_02 + 0x10;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::$_0>
          ::operator()(this_02,__it);
  p_Var4 = (_Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
            *)psVar1;
  if (bVar2) {
    p_Var4 = this_02;
  }
LAB_0057de9f:
  if (p_Var4 == (_Iter_pred<Assimp::D3MF::D3MFOpcPackage::ReadPackageRootRelationship[abi:cxx11](Assimp::IOStream*)::__0>
                 *)reader.m_relationShips.
                   super__Vector_base<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"Cannot find ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   XmlTag::PACKAGE_START_PART_RELATIONSHIP_TYPE_abi_cxx11_);
    DeadlyImportError::DeadlyImportError(this_01,&local_50);
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(*(long *)p_Var4 + 0x40));
  std::
  vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
  ::~vector(&reader.m_relationShips);
  if (xmlReader != (shared_ptr<Assimp::D3MF::OpcPackageRelationship> *)0x0) {
    (*(code *)(((xmlReader->
                super___shared_ptr<Assimp::D3MF::OpcPackageRelationship,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr)->id)._M_string_length)();
  }
  (*(this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string D3MFOpcPackage::ReadPackageRootRelationship(IOStream* stream) {
    std::unique_ptr<CIrrXML_IOStreamReader> xmlStream(new CIrrXML_IOStreamReader(stream));
    std::unique_ptr<XmlReader> xml(irr::io::createIrrXMLReader(xmlStream.get()));

    OpcPackageRelationshipReader reader(xml.get());

    auto itr = std::find_if(reader.m_relationShips.begin(), reader.m_relationShips.end(), [](const OpcPackageRelationshipPtr& rel){
        return rel->type == XmlTag::PACKAGE_START_PART_RELATIONSHIP_TYPE;
    });

    if ( itr == reader.m_relationShips.end() ) {
        throw DeadlyImportError( "Cannot find " + XmlTag::PACKAGE_START_PART_RELATIONSHIP_TYPE );
    }

    return (*itr)->target;
}